

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void CleanNode(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  TidyTagId TVar5;
  Node *pNVar6;
  AttVal *pAVar7;
  Node *node_00;
  Node **ppNVar8;
  
  pNVar6 = node->content;
  if (node->content != (Node *)0x0) {
LAB_001413ba:
    node_00 = pNVar6;
    if (node_00 != (Node *)0x0) {
      pNVar6 = node_00->next;
      BVar4 = prvTidynodeIsElement(node_00);
      if (BVar4 != no) {
        if (node_00->tag == (Dict *)0x0) {
LAB_00141468:
          if (node_00->attributes != (AttVal *)0x0) {
            prvTidyDropAttrByName(doc,node_00,"class");
          }
          CleanNode(doc,node_00);
          goto LAB_001413ba;
        }
        TVar5 = node_00->tag->id;
        if (TVar5 == TidyTag_STYLE) {
          prvTidyDiscardElement(doc,node_00);
          if (node_00->tag == (Dict *)0x0) goto LAB_00141468;
          TVar5 = node_00->tag->id;
        }
        if (TVar5 == TidyTag_A) {
          if (node_00->content != (Node *)0x0) goto LAB_00141468;
          pAVar7 = prvTidyGetAttrByName(node_00,"name");
          if (pAVar7 != (AttVal *)0x0) {
            prvTidyRepairAttrValue(doc,node_00->parent,"id",pAVar7->value);
          }
        }
        else {
          if (TVar5 == TidyTag_SPAN) {
            pNVar6 = node_00->content;
            if (pNVar6 == (Node *)0x0) {
              pNVar6 = prvTidyDiscardElement(doc,node_00);
            }
            else {
              pNVar1 = node_00->parent;
              pNVar2 = node_00->next;
              pNVar3 = node_00->last;
              ppNVar8 = &pNVar2->prev;
              if (pNVar2 == (Node *)0x0) {
                ppNVar8 = &pNVar1->last;
              }
              pNVar3->next = pNVar2;
              *ppNVar8 = pNVar3;
              if (node_00->prev == (Node *)0x0) {
                ppNVar8 = &pNVar1->content;
              }
              else {
                pNVar6->prev = node_00->prev;
                ppNVar8 = &node_00->prev->next;
              }
              *ppNVar8 = pNVar6;
              ppNVar8 = &node_00->content;
              while (pNVar6 = *ppNVar8, pNVar6 != (Node *)0x0) {
                pNVar6->parent = pNVar1;
                ppNVar8 = &pNVar6->next;
              }
              pNVar6 = node_00->content;
              node_00->next = (Node *)0x0;
              node_00->content = (Node *)0x0;
              prvTidyFreeNode(doc,node_00);
            }
            goto LAB_001413ba;
          }
          if ((TVar5 != TidyTag_P) || (node_00->content != (Node *)0x0)) goto LAB_00141468;
        }
        prvTidyDiscardElement(doc,node_00);
      }
      goto LAB_001413ba;
    }
  }
  return;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}